

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void google::protobuf::compiler::objectivec::EmitCommentsString<google::protobuf::FieldDescriptor>
               (Printer *printer,GenerationOptions *opts,FieldDescriptor *descriptor,
               CommentStringFlags flags)

{
  bool bVar1;
  undefined1 local_90 [8];
  SourceLocation location;
  CommentStringFlags flags_local;
  FieldDescriptor *descriptor_local;
  GenerationOptions *opts_local;
  Printer *printer_local;
  
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = flags;
  SourceLocation::SourceLocation((SourceLocation *)local_90);
  bVar1 = FieldDescriptor::GetSourceLocation(descriptor,(SourceLocation *)local_90);
  if (bVar1) {
    EmitCommentsString(printer,opts,(SourceLocation *)local_90,
                       location.leading_detached_comments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_90);
  return;
}

Assistant:

void EmitCommentsString(io::Printer* printer, const GenerationOptions& opts,
                        const TDescriptor* descriptor,
                        CommentStringFlags flags = kCommentStringFlags_None) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    EmitCommentsString(printer, opts, location, flags);
  }
}